

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * constQString(xmlTextReaderPtr reader,xmlChar *prefix,xmlChar *name)

{
  xmlChar *dictString;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlTextReaderPtr reader_local;
  
  if (name == (xmlChar *)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    reader_local = (xmlTextReaderPtr)xmlDictQLookup(reader->dict,prefix,name);
    if (reader_local == (xmlTextReaderPtr)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

static const xmlChar *
constQString(xmlTextReaderPtr reader, const xmlChar *prefix,
             const xmlChar *name) {
    const xmlChar *dictString;

    if (name == NULL)
        return(NULL);

    dictString = xmlDictQLookup(reader->dict, prefix, name);
    if (dictString == NULL)
        xmlTextReaderErrMemory(reader);

    return(dictString);
}